

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * ON_Font::Internal_BestMatchWeightStretchStyle
                    (Weight prefered_weight,Stretch prefered_stretch,Style prefered_style,
                    ON_Font **font_list,size_t font_count)

{
  bool bVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t i;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ON_Font *local_40;
  
  if (font_count == 0 || font_list == (ON_Font **)0x0) {
    pOVar3 = (ON_Font *)0x0;
  }
  else {
    uVar6 = 0xffffffff;
    pOVar2 = (ON_Font *)0x0;
    sVar7 = 0;
    do {
      pOVar3 = font_list[sVar7];
      if (pOVar3 == (ON_Font *)0x0) {
        bVar1 = false;
      }
      else {
        uVar9 = (uint)prefered_weight;
        if (prefered_weight == Unset) {
          uVar9 = (uint)pOVar3->m_font_weight;
        }
        uVar8 = (uint)prefered_stretch;
        if (prefered_stretch == Unset) {
          uVar8 = (uint)pOVar3->m_font_stretch;
        }
        uVar4 = (uint)prefered_style;
        if (prefered_style == Unset) {
          uVar4 = (uint)pOVar3->m_font_style;
        }
        uVar9 = uVar9 - pOVar3->m_font_weight;
        uVar5 = -uVar9;
        if (0 < (int)uVar9) {
          uVar5 = uVar9;
        }
        uVar8 = uVar8 - pOVar3->m_font_stretch;
        uVar9 = -uVar8;
        if (0 < (int)uVar8) {
          uVar9 = uVar8;
        }
        uVar4 = uVar4 - pOVar3->m_font_style;
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        iVar10 = (uVar9 & 0xff) + (uVar5 & 0xff) * 0x14 + (uVar8 & 0xff) * 1000;
        if (iVar10 == 0) {
          bVar1 = true;
          local_40 = pOVar3;
        }
        else {
          uVar9 = iVar10 * 4;
          if (uVar6 <= uVar9 && pOVar2 != (ON_Font *)0x0) {
            pOVar3 = pOVar2;
            uVar9 = uVar6;
          }
          pOVar2 = pOVar3;
          bVar1 = false;
          uVar6 = uVar9;
        }
      }
      pOVar3 = local_40;
    } while ((!bVar1) && (sVar7 = sVar7 + 1, pOVar3 = pOVar2, font_count != sVar7));
  }
  return pOVar3;
}

Assistant:

const ON_Font* ON_Font::Internal_BestMatchWeightStretchStyle(
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  ON_Font const * const * font_list, 
  size_t font_count
)
{
  if (nullptr == font_list || font_count <= 0)
    return nullptr;

  const ON_Font* best_font = nullptr;
  unsigned int best_delta = 0xFFFFFFFF;
  for (size_t i = 0; i < font_count; i++)
  {
    const ON_Font* font = font_list[i];
    if (nullptr == font)
      continue;
    const unsigned int delta = ON_Font::WeightStretchStyleDeviation(
      prefered_weight, 
      prefered_stretch, 
      prefered_style,
      font
    );
    if (0 == delta)
      return font;
    if (nullptr == best_font || delta < best_delta)
    {
      best_font = font;
      best_delta = delta;
    }
  }

  return best_font;
}